

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O1

shared_ptr<Buffer> __thiscall qpdf::Stream::getStreamDataBuffer(Stream *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Members *pMVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Stream *in_RSI;
  shared_ptr<Buffer> sVar3;
  
  pMVar2 = stream(in_RSI);
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (pMVar2->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pMVar2->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
        getStreamDataBuffer() const
        {
            return stream()->stream_data;
        }